

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

bool udpdiscovery::Same(SamePeerMode mode,IpPort *lhv,IpPort *rhv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined1 local_29;
  IpPort *rhv_local;
  IpPort *lhv_local;
  SamePeerMode mode_local;
  
  if (mode == kSamePeerIp) {
    uVar1 = IpPort::ip(lhv);
    uVar2 = IpPort::ip(rhv);
    lhv_local._7_1_ = uVar1 == uVar2;
  }
  else if (mode == kSamePeerIpAndPort) {
    uVar1 = IpPort::ip(lhv);
    uVar2 = IpPort::ip(rhv);
    local_29 = false;
    if (uVar1 == uVar2) {
      iVar3 = IpPort::port(lhv);
      iVar4 = IpPort::port(rhv);
      local_29 = iVar3 == iVar4;
    }
    lhv_local._7_1_ = local_29;
  }
  else {
    lhv_local._7_1_ = false;
  }
  return lhv_local._7_1_;
}

Assistant:

bool Same(PeerParameters::SamePeerMode mode, const IpPort& lhv,
          const IpPort& rhv) {
  switch (mode) {
    case PeerParameters::kSamePeerIp:
      return lhv.ip() == rhv.ip();

    case PeerParameters::kSamePeerIpAndPort:
      return (lhv.ip() == rhv.ip()) && (lhv.port() == rhv.port());
  }

  return false;
}